

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_get_handshake_transcript
              (mbedtls_ssl_context *ssl,mbedtls_md_type_t md,uchar *dst,size_t dst_len,size_t *olen)

{
  size_t *olen_local;
  size_t dst_len_local;
  uchar *dst_local;
  mbedtls_md_type_t md_local;
  mbedtls_ssl_context *ssl_local;
  
  if (md == MBEDTLS_MD_SHA256) {
    ssl_local._4_4_ = ssl_get_handshake_transcript_sha256(ssl,dst,dst_len,olen);
  }
  else {
    ssl_local._4_4_ = -0x6c00;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_get_handshake_transcript(mbedtls_ssl_context *ssl,
                                         const mbedtls_md_type_t md,
                                         unsigned char *dst,
                                         size_t dst_len,
                                         size_t *olen)
{
    switch (md) {

#if defined(MBEDTLS_MD_CAN_SHA384)
        case MBEDTLS_MD_SHA384:
            return ssl_get_handshake_transcript_sha384(ssl, dst, dst_len, olen);
#endif /* MBEDTLS_MD_CAN_SHA384*/

#if defined(MBEDTLS_MD_CAN_SHA256)
        case MBEDTLS_MD_SHA256:
            return ssl_get_handshake_transcript_sha256(ssl, dst, dst_len, olen);
#endif /* MBEDTLS_MD_CAN_SHA256*/

        default:
#if !defined(MBEDTLS_MD_CAN_SHA384) && \
            !defined(MBEDTLS_MD_CAN_SHA256)
            (void) ssl;
            (void) dst;
            (void) dst_len;
            (void) olen;
#endif
            break;
    }
    return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
}